

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

void __thiscall
sparse_parameters::set_default<float,set_initial_wrapper<sparse_parameters>>
          (sparse_parameters *this,float *info)

{
  float *pfVar1;
  float *in_RSI;
  long in_RDI;
  float *new_R;
  
  pfVar1 = calloc_or_throw<float>();
  *pfVar1 = *in_RSI;
  *(float **)(in_RDI + 0x48) = pfVar1;
  *(code **)(in_RDI + 0x58) = set_initial_wrapper<sparse_parameters>::func;
  (**(code **)(in_RDI + 0x58))(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x48));
  return;
}

Assistant:

void set_default(R& info)
  {
    R& new_R = calloc_or_throw<R>();
    new_R = info;
    default_data = &new_R;
    fun = (void (*)(const weight*, void*))T::func;
    fun(default_value, default_data);
  }